

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_operate.c
# Opt level: O0

CURLcode add_parallel_transfers
                   (GlobalConfig *global,CURLM *multi,CURLSH *share,_Bool *morep,_Bool *addedp)

{
  bool bVar1;
  CURLcode CVar2;
  time_t tVar3;
  byte local_5d;
  _Bool local_5b;
  _Bool local_5a;
  _Bool local_59;
  _Bool skipped_1;
  _Bool getadded;
  char *pcStack_58;
  _Bool skipped;
  char *errorbuf;
  int local_48;
  CURLcode CStack_44;
  _Bool sleeping;
  CURLMcode mcode;
  CURLcode result;
  per_transfer *per;
  _Bool *addedp_local;
  _Bool *morep_local;
  CURLSH *share_local;
  CURLM *multi_local;
  GlobalConfig *global_local;
  
  errorbuf._7_1_ = 0;
  *addedp = false;
  *morep = false;
  per = (per_transfer *)addedp;
  addedp_local = morep;
  morep_local = (_Bool *)share;
  share_local = multi;
  multi_local = global;
  if (all_pers < (int)((uint)global->parallel_max << 1)) {
    local_59 = false;
    do {
      CStack_44 = 0;
      CVar2 = create_transfer((GlobalConfig *)multi_local,morep_local,(_Bool *)per,&local_59);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
    } while ((local_59 & 1U) != 0);
  }
  CStack_44 = CURLE_OK;
  _mcode = transfers;
  do {
    bVar1 = false;
    if (_mcode != (per_transfer *)0x0) {
      bVar1 = all_added < (long)(ulong)*(ushort *)((long)multi_local + 0x60);
    }
    if (!bVar1) {
      local_5d = 1;
      if (_mcode == (per_transfer *)0x0) {
        local_5d = errorbuf._7_1_;
      }
      *addedp_local = (_Bool)(local_5d & 1);
      return CURLE_OK;
    }
    if ((((byte)_mcode->field_0x1d8 >> 3 & 1) == 0) && (((byte)_mcode->field_0x1d8 >> 5 & 1) == 0))
    {
      if ((_mcode->startat == 0) || (tVar3 = time((time_t *)0x0), _mcode->startat <= tVar3)) {
        _mcode->field_0x1d8 = _mcode->field_0x1d8 & 0xf7 | 8;
        CStack_44 = pre_transfer((GlobalConfig *)multi_local,_mcode);
        if (CStack_44 != CURLE_OK) {
          return CStack_44;
        }
        pcStack_58 = (char *)malloc(0x100);
        if (pcStack_58 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        curl_easy_setopt(_mcode->curl,0xed,(*(ushort *)((long)multi_local + 99) >> 1 & 1) == 0);
        curl_easy_setopt(_mcode->curl,0x2777,_mcode);
        curl_easy_setopt(_mcode->curl,0x4efb,xferinfo_cb);
        curl_easy_setopt(_mcode->curl,0x2749,_mcode);
        curl_easy_setopt(_mcode->curl,0x2b,0);
        local_48 = curl_multi_add_handle(share_local,_mcode->curl);
        if (local_48 != 0) {
          CStack_44 = CURLE_OUT_OF_MEMORY;
        }
        if (CStack_44 == CURLE_OK) {
          local_5a = false;
          local_5b = false;
          CVar2 = CStack_44;
          do {
            CStack_44 = CVar2;
            CStack_44 = create_transfer((GlobalConfig *)multi_local,morep_local,&local_5a,&local_5b)
            ;
            if (CStack_44 != CURLE_OK) break;
            CVar2 = CURLE_OK;
          } while ((local_5b & 1U) != 0);
        }
        if (CStack_44 != CURLE_OK) {
          free(pcStack_58);
          return CStack_44;
        }
        *pcStack_58 = '\0';
        curl_easy_setopt(_mcode->curl,0x271a,pcStack_58);
        _mcode->errorbuffer = pcStack_58;
        _mcode->field_0x1d8 = _mcode->field_0x1d8 & 0xf7 | 8;
        all_added = all_added + 1;
        *(undefined1 *)&per->next = 1;
      }
      else {
        errorbuf._7_1_ = 1;
      }
    }
    _mcode = _mcode->next;
  } while( true );
}

Assistant:

static CURLcode add_parallel_transfers(struct GlobalConfig *global,
                                       CURLM *multi,
                                       CURLSH *share,
                                       bool *morep,
                                       bool *addedp)
{
  struct per_transfer *per;
  CURLcode result = CURLE_OK;
  CURLMcode mcode;
  bool sleeping = FALSE;
  char *errorbuf;
  *addedp = FALSE;
  *morep = FALSE;
  if(all_pers < (global->parallel_max*2)) {
    bool skipped = FALSE;
    do {
      result = create_transfer(global, share, addedp, &skipped);
      if(result)
        return result;
    } while(skipped);
  }
  for(per = transfers; per && (all_added < global->parallel_max);
      per = per->next) {
    if(per->added || per->skip)
      /* already added or to be skipped */
      continue;
    if(per->startat && (time(NULL) < per->startat)) {
      /* this is still delaying */
      sleeping = TRUE;
      continue;
    }
    per->added = TRUE;

    result = pre_transfer(global, per);
    if(result)
      return result;

    errorbuf = malloc(CURL_ERROR_SIZE);
    if(!errorbuf)
      return CURLE_OUT_OF_MEMORY;

    /* parallel connect means that we do not set PIPEWAIT since pipewait
       will make libcurl prefer multiplexing */
    (void)curl_easy_setopt(per->curl, CURLOPT_PIPEWAIT,
                           global->parallel_connect ? 0L : 1L);
    (void)curl_easy_setopt(per->curl, CURLOPT_PRIVATE, per);
    (void)curl_easy_setopt(per->curl, CURLOPT_XFERINFOFUNCTION, xferinfo_cb);
    (void)curl_easy_setopt(per->curl, CURLOPT_XFERINFODATA, per);
    (void)curl_easy_setopt(per->curl, CURLOPT_NOPROGRESS, 0L);
#ifdef DEBUGBUILD
    if(getenv("CURL_FORBID_REUSE"))
      (void)curl_easy_setopt(per->curl, CURLOPT_FORBID_REUSE, 1L);
#endif

    mcode = curl_multi_add_handle(multi, per->curl);
    if(mcode) {
      DEBUGASSERT(mcode == CURLM_OUT_OF_MEMORY);
      result = CURLE_OUT_OF_MEMORY;
    }

    if(!result) {
      bool getadded = FALSE;
      bool skipped = FALSE;
      do {
        result = create_transfer(global, share, &getadded, &skipped);
        if(result)
          break;
      } while(skipped);
    }
    if(result) {
      free(errorbuf);
      return result;
    }
    errorbuf[0] = 0;
    (void)curl_easy_setopt(per->curl, CURLOPT_ERRORBUFFER, errorbuf);
    per->errorbuffer = errorbuf;
    per->added = TRUE;
    all_added++;
    *addedp = TRUE;
  }
  *morep = (per || sleeping);
  return CURLE_OK;
}